

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

int proc_spawn_sync(char **args)

{
  __pid_t _Var1;
  int iVar2;
  uint local_18;
  int w;
  int wstatus;
  pid_t pid;
  char **args_local;
  
  _wstatus = args;
  w = proc_spawn(args);
  local_18 = 0;
  _Var1 = waitpid(0,(int *)&local_18,0);
  if (_Var1 < 0) {
    perror("waitpid");
    exit(1);
  }
  if (((local_18 & 0x7f) != 0) && ((char)(((byte)local_18 & 0x7f) + 1) >> 1 < '\x01')) {
    __assert_fail("WIFEXITED(wstatus) || WIFSIGNALED(wstatus)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/proc.c"
                  ,0x69,"int proc_spawn_sync(char *const *)");
  }
  iVar2 = wstatus_to_exit_status(w,local_18);
  return iVar2;
}

Assistant:

int proc_spawn_sync(char *const args[]) {
    pid_t pid = proc_spawn(args);
    int wstatus = 0;
    int w = waitpid(0, &wstatus, 0);
    if (w < 0) {
        perror("waitpid");
        exit(EXIT_FAILURE);
    }

    assert(WIFEXITED(wstatus) || WIFSIGNALED(wstatus));
    return wstatus_to_exit_status(pid, wstatus);
}